

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O1

void __thiscall icu_63::Normalizer2DataBuilder::postProcess(Normalizer2DataBuilder *this,Norm *norm)

{
  short sVar1;
  UVector32 *pUVar2;
  UBool UVar3;
  char *pcVar4;
  Norm *pNVar5;
  uint8_t uVar6;
  int iVar7;
  bool bVar8;
  BuilderReorderingBuffer buffer;
  BuilderReorderingBuffer local_a8;
  
  if ((int)norm->mappingType < 2) {
    uVar6 = norm->cc;
    norm->trailCC = uVar6;
    norm->leadCC = uVar6;
    bVar8 = norm->combinesBack == '\0' && uVar6 == '\0';
    norm->hasCompBoundaryBefore = bVar8;
    pUVar2 = norm->compositions;
    norm->hasCompBoundaryAfter = pUVar2 == (UVector32 *)0x0 && bVar8;
    if (norm->combinesBack != '\0') {
      if (pUVar2 != (UVector32 *)0x0) {
        norm->type = MAYBE_YES_COMBINES_FWD;
        return;
      }
      norm->type = MAYBE_YES_SIMPLE;
      return;
    }
    if (pUVar2 != (UVector32 *)0x0) {
      norm->type = YES_YES_COMBINES_FWD;
      return;
    }
    if (uVar6 != '\0') {
      norm->type = YES_YES_WITH_CC;
      return;
    }
    norm->type = INERT;
    return;
  }
  sVar1 = (norm->mapping->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar7 = (norm->mapping->fUnion).fFields.fLength;
  }
  else {
    iVar7 = (int)sVar1 >> 5;
  }
  if (iVar7 < 0x20) {
    local_a8.fLength = 0;
    local_a8.fLastStarterIndex = -1;
    local_a8.fDidReorder = '\0';
    if (norm->rawMapping != (UnicodeString *)0x0) {
      Norms::reorder(&this->norms,norm->rawMapping,&local_a8);
    }
    local_a8.fDidReorder = '\0';
    local_a8.fLength = 0;
    local_a8.fLastStarterIndex = -1;
    Norms::reorder(&this->norms,norm->mapping,&local_a8);
    if ((long)local_a8.fLength == 0) {
      norm->leadCC = '\x01';
      uVar6 = 0xff;
    }
    else {
      norm->leadCC = (uint8_t)local_a8.fArray[0];
      uVar6 = (uint8_t)local_a8.fArray[(long)local_a8.fLength + -1];
    }
    norm->trailCC = uVar6;
    bVar8 = false;
    if ((local_a8.fLength != 0) && (bVar8 = false, norm->leadCC == '\0')) {
      iVar7 = local_a8.fArray[0] >> 8;
      if (iVar7 - 0x11c3U < 0xffffffe5 && iVar7 - 0x1176U < 0xffffffeb) {
        pNVar5 = Norms::getNormRef(&this->norms,iVar7);
        bVar8 = pNVar5->combinesBack == '\0';
      }
      else {
        bVar8 = false;
      }
    }
    norm->hasCompBoundaryBefore = bVar8;
    if (norm->compositions == (UVector32 *)0x0) {
      UVar3 = mappingHasCompBoundaryAfter(this,&local_a8,norm->mappingType);
      bVar8 = UVar3 != '\0';
    }
    else {
      bVar8 = false;
    }
    norm->hasCompBoundaryAfter = bVar8;
    if (norm->combinesBack == '\0') {
      if (norm->mappingType == ROUND_TRIP) {
        if (norm->compositions != (UVector32 *)0x0) {
          norm->type = YES_NO_COMBINES_FWD;
          return;
        }
        norm->type = YES_NO_MAPPING_ONLY;
        return;
      }
      if (norm->compositions == (UVector32 *)0x0) {
        if (local_a8.fLength == 0) {
          norm->type = NO_NO_EMPTY;
          return;
        }
        if (norm->hasCompBoundaryBefore != '\0') {
          UVar3 = mappingRecomposes(this,&local_a8);
          if (UVar3 != '\0') {
            norm->type = NO_NO_COMP_BOUNDARY_BEFORE;
            return;
          }
          norm->type = NO_NO_COMP_YES;
          return;
        }
        norm->type = NO_NO_COMP_NO_MAYBE_CC;
        return;
      }
      pcVar4 = "combines-forward and has a one-way mapping, not possible in Unicode normalization";
    }
    else {
      pcVar4 = "combines-back and decomposes, not possible in Unicode normalization";
    }
  }
  else {
    pcVar4 = "mapping longer than maximum of 31";
  }
  norm->error = pcVar4;
  return;
}

Assistant:

void Normalizer2DataBuilder::postProcess(Norm &norm) {
    // Prerequisites: Compositions are built, mappings are recursively decomposed.
    // Mappings are not yet in canonical order.
    //
    // This function works on a Norm struct. We do not know which code point(s) map(s) to it.
    // Therefore, we cannot compute algorithmic mapping deltas here.
    // Error conditions are checked, but printed later when we do know the offending code point.
    if(norm.hasMapping()) {
        if(norm.mapping->length()>Normalizer2Impl::MAPPING_LENGTH_MASK) {
            norm.error="mapping longer than maximum of 31";
            return;
        }
        // Ensure canonical order.
        BuilderReorderingBuffer buffer;
        if(norm.rawMapping!=nullptr) {
            norms.reorder(*norm.rawMapping, buffer);
            buffer.reset();
        }
        norms.reorder(*norm.mapping, buffer);
        if(buffer.isEmpty()) {
            // A character that is deleted (maps to an empty string) must
            // get the worst-case lccc and tccc values because arbitrary
            // characters on both sides will become adjacent.
            norm.leadCC=1;
            norm.trailCC=0xff;
        } else {
            norm.leadCC=buffer.ccAt(0);
            norm.trailCC=buffer.ccAt(buffer.length()-1);
        }

        norm.hasCompBoundaryBefore=
            !buffer.isEmpty() && norm.leadCC==0 && !norms.combinesBack(buffer.charAt(0));
        norm.hasCompBoundaryAfter=
            norm.compositions==nullptr && mappingHasCompBoundaryAfter(buffer, norm.mappingType);

        if(norm.combinesBack) {
            norm.error="combines-back and decomposes, not possible in Unicode normalization";
        } else if(norm.mappingType==Norm::ROUND_TRIP) {
            if(norm.compositions!=NULL) {
                norm.type=Norm::YES_NO_COMBINES_FWD;
            } else {
                norm.type=Norm::YES_NO_MAPPING_ONLY;
            }
        } else {  // one-way mapping
            if(norm.compositions!=NULL) {
                norm.error="combines-forward and has a one-way mapping, "
                           "not possible in Unicode normalization";
            } else if(buffer.isEmpty()) {
                norm.type=Norm::NO_NO_EMPTY;
            } else if(!norm.hasCompBoundaryBefore) {
                norm.type=Norm::NO_NO_COMP_NO_MAYBE_CC;
            } else if(mappingRecomposes(buffer)) {
                norm.type=Norm::NO_NO_COMP_BOUNDARY_BEFORE;
            } else {
                // The mapping is comp-normalized.
                norm.type=Norm::NO_NO_COMP_YES;
            }
        }
    } else {  // no mapping
        norm.leadCC=norm.trailCC=norm.cc;

        norm.hasCompBoundaryBefore=
            norm.cc==0 && !norm.combinesBack;
        norm.hasCompBoundaryAfter=
            norm.cc==0 && !norm.combinesBack && norm.compositions==nullptr;

        if(norm.combinesBack) {
            if(norm.compositions!=nullptr) {
                // Earlier code checked ccc=0.
                norm.type=Norm::MAYBE_YES_COMBINES_FWD;
            } else {
                norm.type=Norm::MAYBE_YES_SIMPLE;  // any ccc
            }
        } else if(norm.compositions!=nullptr) {
            // Earlier code checked ccc=0.
            norm.type=Norm::YES_YES_COMBINES_FWD;
        } else if(norm.cc!=0) {
            norm.type=Norm::YES_YES_WITH_CC;
        } else {
            norm.type=Norm::INERT;
        }
    }
}